

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmyblas2.c
# Opt level: O0

void zlsolve(int ldm,int ncol,doublecomplex *M,doublecomplex *rhs)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *pdVar6;
  doublecomplex *pdVar7;
  doublecomplex *pdVar8;
  doublecomplex *pdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double ci_12;
  double cr_12;
  double ci_11;
  double cr_11;
  double ci_10;
  double cr_10;
  double ci_9;
  double cr_9;
  double ci_8;
  double cr_8;
  double ci_7;
  double cr_7;
  double ci_6;
  double cr_6;
  double ci_5;
  double cr_5;
  double ci_4;
  double cr_4;
  double ci_3;
  double cr_3;
  double ci_2;
  double cr_2;
  double ci_1;
  double cr_1;
  double ci;
  double cr;
  doublecomplex *pdStack_a0;
  int firstcol;
  doublecomplex *Mki3;
  doublecomplex *Mki2;
  doublecomplex *Mki1;
  doublecomplex *Mki0;
  doublecomplex *M0;
  doublecomplex temp;
  doublecomplex x3;
  doublecomplex x2;
  doublecomplex x1;
  doublecomplex x0;
  int k;
  doublecomplex *rhs_local;
  doublecomplex *M_local;
  int ncol_local;
  int ldm_local;
  
  cr._4_4_ = 0;
  Mki0 = M;
  while (cr._4_4_ < ncol + -3) {
    pdVar7 = Mki0 + 1;
    pdVar8 = pdVar7 + (long)ldm + 1;
    pdVar9 = pdVar8 + (long)ldm + 1;
    dVar4 = rhs[cr._4_4_].r;
    dVar5 = rhs[cr._4_4_].i;
    dVar10 = rhs[cr._4_4_ + 1].r - (dVar4 * pdVar7->r + -(dVar5 * Mki0[1].i));
    dVar11 = rhs[cr._4_4_ + 1].i - (dVar5 * pdVar7->r + dVar4 * Mki0[1].i);
    dVar12 = (rhs[cr._4_4_ + 2].r - (dVar4 * Mki0[2].r + -(dVar5 * Mki0[2].i))) -
             (dVar10 * pdVar8->r + -(dVar11 * pdVar7[(long)ldm + 1].i));
    dVar13 = (rhs[cr._4_4_ + 2].i - (dVar5 * Mki0[2].r + dVar4 * Mki0[2].i)) -
             (dVar11 * pdVar8->r + dVar10 * pdVar7[(long)ldm + 1].i);
    Mki1 = Mki0 + 4;
    Mki2 = pdVar7 + (long)ldm + 3;
    Mki3 = pdVar8 + (long)ldm + 2;
    dVar14 = ((rhs[cr._4_4_ + 3].r - (dVar4 * Mki0[3].r + -(dVar5 * Mki0[3].i))) -
             (dVar10 * pdVar7[(long)ldm + 2].r + -(dVar11 * pdVar7[(long)ldm + 2].i))) -
             (dVar12 * pdVar9->r + -(dVar13 * pdVar8[(long)ldm + 1].i));
    dVar15 = ((rhs[cr._4_4_ + 3].i - (dVar5 * Mki0[3].r + dVar4 * Mki0[3].i)) -
             (dVar11 * pdVar7[(long)ldm + 2].r + dVar10 * pdVar7[(long)ldm + 2].i)) -
             (dVar13 * pdVar9->r + dVar12 * pdVar8[(long)ldm + 1].i);
    rhs[cr._4_4_ + 1].r = dVar10;
    rhs[cr._4_4_ + 1].i = dVar11;
    rhs[cr._4_4_ + 2].r = dVar12;
    rhs[cr._4_4_ + 2].i = dVar13;
    rhs[cr._4_4_ + 3].r = dVar14;
    rhs[cr._4_4_ + 3].i = dVar15;
    cr._4_4_ = cr._4_4_ + 4;
    pdVar7 = pdVar9 + ldm;
    for (x0.i._4_4_ = cr._4_4_; pdStack_a0 = pdVar7 + 1, x0.i._4_4_ < ncol;
        x0.i._4_4_ = x0.i._4_4_ + 1) {
      pdVar6 = &Mki1->r;
      pdVar1 = &Mki1->i;
      dVar2 = Mki1->r;
      dVar3 = Mki1->i;
      Mki1 = Mki1 + 1;
      rhs[x0.i._4_4_].r = rhs[x0.i._4_4_].r - (dVar4 * *pdVar6 + -(dVar5 * *pdVar1));
      rhs[x0.i._4_4_].i = rhs[x0.i._4_4_].i - (dVar5 * dVar2 + dVar4 * dVar3);
      pdVar6 = &Mki2->r;
      pdVar1 = &Mki2->i;
      dVar2 = Mki2->r;
      dVar3 = Mki2->i;
      Mki2 = Mki2 + 1;
      rhs[x0.i._4_4_].r = rhs[x0.i._4_4_].r - (dVar10 * *pdVar6 + -(dVar11 * *pdVar1));
      rhs[x0.i._4_4_].i = rhs[x0.i._4_4_].i - (dVar11 * dVar2 + dVar10 * dVar3);
      pdVar6 = &Mki3->r;
      pdVar1 = &Mki3->i;
      dVar2 = Mki3->r;
      dVar3 = Mki3->i;
      Mki3 = Mki3 + 1;
      rhs[x0.i._4_4_].r = rhs[x0.i._4_4_].r - (dVar12 * *pdVar6 + -(dVar13 * *pdVar1));
      rhs[x0.i._4_4_].i = rhs[x0.i._4_4_].i - (dVar13 * dVar2 + dVar12 * dVar3);
      dVar2 = pdStack_a0->r;
      dVar3 = pdVar7[1].i;
      rhs[x0.i._4_4_].r = rhs[x0.i._4_4_].r - (dVar14 * pdStack_a0->r + -(dVar15 * pdVar7[1].i));
      rhs[x0.i._4_4_].i = rhs[x0.i._4_4_].i - (dVar15 * dVar2 + dVar14 * dVar3);
      pdVar7 = pdStack_a0;
    }
    Mki0 = Mki0 + (ldm * 4 + 4);
  }
  if (cr._4_4_ < ncol + -1) {
    pdVar7 = Mki0 + 1;
    dVar4 = rhs[cr._4_4_].r;
    dVar5 = rhs[cr._4_4_].i;
    Mki1 = Mki0 + 2;
    dVar10 = rhs[cr._4_4_ + 1].r - (dVar4 * pdVar7->r + -(dVar5 * Mki0[1].i));
    dVar11 = rhs[cr._4_4_ + 1].i - (dVar5 * pdVar7->r + dVar4 * Mki0[1].i);
    rhs[cr._4_4_ + 1].r = dVar10;
    rhs[cr._4_4_ + 1].i = dVar11;
    pdVar7 = pdVar7 + ldm;
    for (x0.i._4_4_ = cr._4_4_ + 2; Mki2 = pdVar7 + 1, x0.i._4_4_ < ncol;
        x0.i._4_4_ = x0.i._4_4_ + 1) {
      pdVar6 = &Mki1->r;
      pdVar1 = &Mki1->i;
      dVar12 = Mki1->r;
      dVar13 = Mki1->i;
      Mki1 = Mki1 + 1;
      rhs[x0.i._4_4_].r = rhs[x0.i._4_4_].r - (dVar4 * *pdVar6 + -(dVar5 * *pdVar1));
      rhs[x0.i._4_4_].i = rhs[x0.i._4_4_].i - (dVar5 * dVar12 + dVar4 * dVar13);
      dVar12 = Mki2->r;
      dVar13 = pdVar7[1].i;
      rhs[x0.i._4_4_].r = rhs[x0.i._4_4_].r - (dVar10 * Mki2->r + -(dVar11 * pdVar7[1].i));
      rhs[x0.i._4_4_].i = rhs[x0.i._4_4_].i - (dVar11 * dVar12 + dVar10 * dVar13);
      pdVar7 = Mki2;
    }
  }
  return;
}

Assistant:

void zlsolve ( int ldm, int ncol, doublecomplex *M, doublecomplex *rhs )
{
    int k;
    doublecomplex x0, x1, x2, x3, temp;
    doublecomplex *M0;
    doublecomplex *Mki0, *Mki1, *Mki2, *Mki3;
    register int firstcol = 0;

    M0 = &M[0];


    while ( firstcol < ncol - 3 ) { /* Do 4 columns */
      	Mki0 = M0 + 1;
      	Mki1 = Mki0 + ldm + 1;
      	Mki2 = Mki1 + ldm + 1;
      	Mki3 = Mki2 + ldm + 1;

      	x0 = rhs[firstcol];
      	zz_mult(&temp, &x0, Mki0); Mki0++;
      	z_sub(&x1, &rhs[firstcol+1], &temp);
      	zz_mult(&temp, &x0, Mki0); Mki0++;
	z_sub(&x2, &rhs[firstcol+2], &temp);
	zz_mult(&temp, &x1, Mki1); Mki1++;
	z_sub(&x2, &x2, &temp);
      	zz_mult(&temp, &x0, Mki0); Mki0++;
	z_sub(&x3, &rhs[firstcol+3], &temp);
	zz_mult(&temp, &x1, Mki1); Mki1++;
	z_sub(&x3, &x3, &temp);
	zz_mult(&temp, &x2, Mki2); Mki2++;
	z_sub(&x3, &x3, &temp);

 	rhs[++firstcol] = x1;
      	rhs[++firstcol] = x2;
      	rhs[++firstcol] = x3;
      	++firstcol;
    
      	for (k = firstcol; k < ncol; k++) {
	    zz_mult(&temp, &x0, Mki0); Mki0++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	    zz_mult(&temp, &x1, Mki1); Mki1++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	    zz_mult(&temp, &x2, Mki2); Mki2++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	    zz_mult(&temp, &x3, Mki3); Mki3++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	}

        M0 += 4 * ldm + 4;
    }

    if ( firstcol < ncol - 1 ) { /* Do 2 columns */
        Mki0 = M0 + 1;
        Mki1 = Mki0 + ldm + 1;

        x0 = rhs[firstcol];
	zz_mult(&temp, &x0, Mki0); Mki0++;
	z_sub(&x1, &rhs[firstcol+1], &temp);

      	rhs[++firstcol] = x1;
      	++firstcol;
    
      	for (k = firstcol; k < ncol; k++) {
	    zz_mult(&temp, &x0, Mki0); Mki0++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	    zz_mult(&temp, &x1, Mki1); Mki1++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	} 
    }
    
}